

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

undefined8 __thiscall
StringInstance::op_atIndex
          (StringInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  char cVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  undefined8 *puVar5;
  char *pcVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  int index;
  allocator *__rhs;
  int iVar7;
  allocator local_c1;
  string local_c0 [8];
  string *in_stack_ffffffffffffff48;
  IntegerInstance *in_stack_ffffffffffffff50;
  string local_a0 [32];
  IntegerInstance local_80;
  int local_1c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  
  local_18 = in_RDX;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDX);
  if (sVar4 != 1) {
    puVar5 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar5 = "RuntimeError: wrong number of arguments.";
    __cxa_throw(puVar5,&char_const*::typeinfo,0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_18,0);
  IntegerInstance::IntegerInstance(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  iVar2 = IntegerInstance::value(&local_80);
  IntegerInstance::~IntegerInstance((IntegerInstance *)0x1bbf82);
  local_1c = iVar2;
  if (-1 < iVar2) {
    iVar7 = iVar2;
    iVar3 = std::__cxx11::string::size();
    if (iVar2 < iVar3) {
      pcVar6 = (char *)std::__cxx11::string::operator[](in_RSI + 0x58);
      cVar1 = *pcVar6;
      __rhs = &local_c1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c0,1,cVar1,__rhs);
      std::operator+((char *)CONCAT44(iVar7,iVar2),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(iVar7,iVar2),(char *)__rhs);
      std::__cxx11::string::~string(local_a0);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      return in_RDI;
    }
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = "RuntimeError: invalid argument.";
  __cxa_throw(puVar5,&char_const*::typeinfo,0);
}

Assistant:

std::string StringInstance::op_atIndex(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    int index = IntegerInstance(arguments[0]).value();
    if (index < 0 || index >= int(_value.size()))
        throw EXC_INVALID_ARGUMENT;
    return "'" + std::string(1, _value[index]) + "'";
}